

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t>_>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
::get_edges(vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t>_>
            *__return_storage_ptr__,
           Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
           *this)

{
  int iVar1;
  pointer pvVar2;
  pointer pvVar3;
  iterator __position;
  simplex_t *psVar4;
  ulong uVar5;
  long extraout_RDX;
  vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t>_>
  *edges;
  pointer pvVar6;
  ulong uVar7;
  diameter_simplex_t local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < this->n) {
    uVar7 = 0;
    do {
      pvVar2 = (this->dist).neighbors.
               super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = uVar7 * 3;
      pvVar3 = *(pointer *)((long)(pvVar2 + uVar7) + 8);
      for (pvVar6 = *(pointer *)
                     &pvVar2[uVar7].
                      super__Vector_base<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>
          ; pvVar6 != pvVar3; pvVar6 = pvVar6 + 1) {
        iVar1 = pvVar6->i;
        if ((long)iVar1 < (long)uVar7) {
          local_58.diameter = pvVar6->d;
          psVar4 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                             ((simplex_t *)&this->simplex_encoding,
                              (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
                               *)(uVar7 & 0xffffffff),2,(dimension_t)uVar5);
          uVar5 = (ulong)iVar1;
          local_58.index._0_8_ = (long)psVar4 + uVar5;
          local_58.index._8_8_ =
               extraout_RDX + ((long)uVar5 >> 0x3f) + (ulong)CARRY8((ulong)psVar4,uVar5);
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,unsigned__int128,float>>,Gudhi::ripser::TParams<true,unsigned__int128,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,unsigned__int128,float>>,Gudhi::ripser::TParams<true,unsigned__int128,float>>::diameter_simplex_t>>
            ::
            _M_realloc_insert<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,unsigned__int128,float>>,Gudhi::ripser::TParams<true,unsigned__int128,float>>::diameter_simplex_t>
                      ((vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,unsigned__int128,float>>,Gudhi::ripser::TParams<true,unsigned__int128,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,unsigned__int128,float>>,Gudhi::ripser::TParams<true,unsigned__int128,float>>::diameter_simplex_t>>
                        *)__return_storage_ptr__,__position,&local_58);
          }
          else {
            *(long *)&(__position._M_current)->index = (long)local_58.index;
            *(long *)((long)&(__position._M_current)->index + 8) = local_58.index._8_8_;
            *(ulong *)__position._M_current = CONCAT44(local_58._4_4_,local_58.diameter);
            *(undefined8 *)&(__position._M_current)->field_0x8 = local_58._8_8_;
            (__return_storage_ptr__->
            super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_simplex_t>_>
            )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)this->n);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<diameter_simplex_t> get_edges() {
    if constexpr (!std::is_same_v<typename DistanceMatrix::Category, Tag_sparse>) { // Compressed_lower_distance_matrix
      // TODO: it would be convenient to have DistanceMatrix provide a range of neighbors at dist<=threshold even in the dense case (as a filtered_range)
      std::vector<diameter_simplex_t> edges;
      for (vertex_t i = 0; i < n; ++i) {
        for (vertex_t j = 0; j < i; ++j) {
          value_t length = dist(i, j);
          if (length <= threshold) edges.push_back({length, get_edge_index(i, j)});
        }
      }
      return edges;
    } else { // Sparse_distance_matrix
      std::vector<diameter_simplex_t> edges;
      for (vertex_t i = 0; i < n; ++i)
        for (auto n : dist.neighbors[i]) {
          vertex_t j = get_vertex(n);
          if (i > j) edges.push_back({get_diameter(n), get_edge_index(i, j)});
        }
      return edges;
    }
  }